

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::CoverageBinInitializerSyntax::isKind(SyntaxKind kind)

{
  bool local_9;
  SyntaxKind kind_local;
  
  if ((((kind == DefaultCoverageBinInitializer) || (kind == ExpressionCoverageBinInitializer)) ||
      (kind == IdWithExprCoverageBinInitializer)) ||
     ((kind == RangeCoverageBinInitializer || (kind == TransListCoverageBinInitializer)))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool CoverageBinInitializerSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DefaultCoverageBinInitializer:
        case SyntaxKind::ExpressionCoverageBinInitializer:
        case SyntaxKind::IdWithExprCoverageBinInitializer:
        case SyntaxKind::RangeCoverageBinInitializer:
        case SyntaxKind::TransListCoverageBinInitializer:
            return true;
        default:
            return false;
    }
}